

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 __thiscall simd_test_sse4_1::c_imm_v128_shr_n_s8<7>(simd_test_sse4_1 *this,c_v128 a)

{
  c_v128 cVar1;
  
  cVar1.s8[9] = -(a.s8[1] < '\0');
  cVar1.s8[8] = -(a.s8[0] < '\0');
  cVar1.s8[10] = -(a.s8[2] < '\0');
  cVar1.s8[0xb] = -(a.s8[3] < '\0');
  cVar1.s8[0xc] = -(a.s8[4] < '\0');
  cVar1.s8[0xd] = -(a.s8[5] < '\0');
  cVar1.s8[0xe] = -(a.s8[6] < '\0');
  cVar1.s8[0xf] = -(a.s8[7] < '\0');
  cVar1.s8[1] = -((char)((ulong)this >> 8) < '\0');
  cVar1.s8[0] = -((char)this < '\0');
  cVar1.s8[2] = -((char)((ulong)this >> 0x10) < '\0');
  cVar1.s8[3] = -((char)((ulong)this >> 0x18) < '\0');
  cVar1.s8[4] = -((char)((ulong)this >> 0x20) < '\0');
  cVar1.s8[5] = -((char)((ulong)this >> 0x28) < '\0');
  cVar1.s8[6] = -((char)((ulong)this >> 0x30) < '\0');
  cVar1.s8[7] = -((long)this < 0);
  return cVar1;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}